

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

ImVector_ImDrawIdx * ImVector_ImDrawIdx_ImVector_ImDrawIdxVector(ImVector_ImDrawIdx *src)

{
  uint uVar1;
  ImVector_ImDrawIdx *pIVar2;
  unsigned_short *__dest;
  uint uVar3;
  
  pIVar2 = (ImVector_ImDrawIdx *)ImGui::MemAlloc(0x10);
  pIVar2->Size = 0;
  pIVar2->Capacity = 0;
  pIVar2->Data = (unsigned_short *)0x0;
  uVar1 = src->Size;
  if ((long)(int)uVar1 < 1) {
    __dest = (unsigned_short *)0x0;
  }
  else {
    uVar3 = 8;
    if (8 < uVar1) {
      uVar3 = uVar1;
    }
    __dest = (unsigned_short *)ImGui::MemAlloc((ulong)(uVar3 * 2));
    if (pIVar2->Data != (unsigned_short *)0x0) {
      memcpy(__dest,pIVar2->Data,(long)pIVar2->Size * 2);
      ImGui::MemFree(pIVar2->Data);
    }
    pIVar2->Data = __dest;
    pIVar2->Capacity = uVar3;
  }
  pIVar2->Size = uVar1;
  memcpy(__dest,src->Data,(long)(int)uVar1 * 2);
  return pIVar2;
}

Assistant:

CIMGUI_API ImVector_ImDrawIdx* ImVector_ImDrawIdx_ImVector_ImDrawIdxVector(const ImVector_ImDrawIdx src)
{
    return IM_NEW(ImVector_ImDrawIdx)(src);
}